

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O0

double tcdf(double t,int df)

{
  double x_00;
  double dVar1;
  double I;
  double x;
  double oup;
  int df_local;
  double t_local;
  
  if (df < 1) {
    printf("Degree Of Freedom should be a positive real integer");
    exit(1);
  }
  x_00 = (double)df / (t * t + (double)df);
  dVar1 = ibeta(x_00,(double)df / 2.0,0.5);
  x = 1.0 - dVar1 * 0.5;
  if (t < 0.0) {
    x = 1.0 - x;
  }
  if ((x_00 == 0.0) && (!NAN(x_00))) {
    x = 0.5;
  }
  return x;
}

Assistant:

double tcdf(double t, int df) {
	double oup,x,I;
	
	if (df <= 0) {
		printf("Degree Of Freedom should be a positive real integer");
		exit(1);
	}
	
	x = df / (df + t * t);
	
	I = 0.5 * ibeta(x,df / 2.0, 1./2.);
	
	oup = 1. - I;
	
	if ( t < 0.) {
		oup = 1. - oup;
	}
	
	if ( x == 0.) {
		oup = 0.5;
	}
	
	
	return oup;
}